

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

void __thiscall pbrt::SpotLight::PDF_Le(SpotLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  
  fVar1 = this->cosFalloffStart;
  fVar7 = 1.0;
  fVar4 = 1.0 - fVar1;
  fVar2 = this->cosFalloffEnd;
  *pdfPos = 0.0;
  fVar2 = (fVar1 - fVar2) * 0.5;
  auVar6 = vfmadd132ss_fma(ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]),
                           ZEXT416((uint)((ray->d).super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->super_LightBase).renderFromLight.mInv.m[2][1])),
                           ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]
                                         ),
                           ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.z));
  fVar1 = this->cosFalloffStart;
  fVar9 = auVar6._0_4_;
  if (fVar1 <= fVar9) {
    fVar10 = fVar4 * (1.0 / ((1.0 - fVar1) * 6.2831855));
    fVar4 = fVar4 + fVar2;
  }
  else {
    fVar10 = 0.0;
    if ((fVar9 <= fVar1) && (fVar3 = this->cosFalloffEnd, fVar3 <= fVar9)) {
      if ((fVar3 != fVar1) || (NAN(fVar3) || NAN(fVar1))) {
        auVar11._0_12_ = ZEXT812(0);
        auVar11._12_4_ = 0;
        auVar8._0_4_ = (fVar9 - fVar3) / (fVar1 - fVar3);
        auVar8._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar8);
        uVar5 = vcmpss_avx512f(auVar8,auVar11,1);
        fVar7 = (float)((uint)!(bool)((byte)uVar5 & 1) * auVar6._0_4_);
        auVar6._0_4_ = fVar7;
        auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar6,ZEXT416(0x40400000));
        fVar7 = fVar7 * fVar7 * auVar6._0_4_;
      }
      fVar10 = (2.0 / (fVar1 - fVar3)) * fVar7;
    }
    fVar4 = (fVar4 + fVar2) * 6.2831855;
    fVar10 = fVar2 * fVar10;
  }
  *pdfDir = fVar10 / fVar4;
  return;
}

Assistant:

void SpotLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    Float p[2] = {1 - cosFalloffStart, (cosFalloffStart - cosFalloffEnd) / 2};
    *pdfPos = 0;
    // Find spotlight directional PDF based on $\cos \theta$
    Float cosTheta = CosTheta(renderFromLight.ApplyInverse(ray.d));
    if (cosTheta >= cosFalloffStart)
        *pdfDir = UniformConePDF(cosFalloffStart) * p[0] / (p[0] + p[1]);
    else
        *pdfDir = SmoothStepPDF(cosTheta, cosFalloffEnd, cosFalloffStart) * p[1] /
                  ((p[0] + p[1]) * (2 * Pi));
}